

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::fromDecimalDigits
                (bitwidth_t bits,bool isSigned,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  long lVar1;
  byte bVar2;
  size_type sVar3;
  undefined8 extraout_RDX;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  __type_conflict3 _Var4;
  SVInt SVar5;
  long local_98;
  size_t j_1;
  size_t j;
  size_t i;
  anon_class_32_4_88832beb writeWord;
  anon_class_8_1_54a39804 nextDigit;
  uint64_t word;
  uint32_t count;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint64_t maxWord;
  logic_t *d;
  undefined1 local_26;
  undefined1 local_25;
  int charsPerWord;
  undefined1 auStack_20 [3];
  bool isSigned_local;
  bitwidth_t bits_local;
  span<const_slang::logic_t,_18446744073709551615UL> digits_local;
  SVInt *result;
  
  this.val._4_4_ = in_register_0000003c;
  this.val._0_4_ = bits;
  _auStack_20 = (pointer)digits.size_;
  charsPerWord = (int)CONCAT71(in_register_00000031,isSigned);
  local_25 = (byte)digits.data_ & 1;
  local_26 = 0;
  digits_local.size_ = (size_type)this;
  allocZeroed((SVInt *)this.pVal,charsPerWord,(bool)local_25,false);
  d._4_4_ = 0x12;
  maxWord = (uint64_t)
            nonstd::span_lite::span<const_slang::logic_t,_18446744073709551615UL>::data
                      ((span<const_slang::logic_t,_18446744073709551615UL> *)auStack_20);
  _Var4 = std::pow<int,int>(10,0x12);
  local_40.val = (long)_Var4 | (long)(_Var4 - 9.223372036854776e+18) & (long)_Var4 >> 0x3f;
  word._0_4_ = 0;
  writeWord.maxWord = &maxWord;
  i = (size_t)&word;
  writeWord.count = (uint32_t *)&nextDigit;
  writeWord.result = (SVInt *)&local_40;
  writeWord.word = this.pVal;
  for (j = 0x12;
      sVar3 = nonstd::span_lite::span<const_slang::logic_t,_18446744073709551615UL>::size
                        ((span<const_slang::logic_t,_18446744073709551615UL> *)auStack_20),
      j < sVar3; j = j + 0x12) {
    bVar2 = fromDecimalDigits::anon_class_8_1_54a39804::operator()
                      ((anon_class_8_1_54a39804 *)&writeWord.maxWord);
    nextDigit.d = (logic_t **)(ulong)bVar2;
    for (j_1 = 0x11; j_1 != 0; j_1 = j_1 - 1) {
      lVar1 = (long)nextDigit.d * 10;
      bVar2 = fromDecimalDigits::anon_class_8_1_54a39804::operator()
                        ((anon_class_8_1_54a39804 *)&writeWord.maxWord);
      nextDigit.d = (logic_t **)(lVar1 + (ulong)bVar2);
    }
    fromDecimalDigits::anon_class_32_4_88832beb::operator()((anon_class_32_4_88832beb *)&i);
  }
  local_40.val = 10;
  bVar2 = fromDecimalDigits::anon_class_8_1_54a39804::operator()
                    ((anon_class_8_1_54a39804 *)&writeWord.maxWord);
  nextDigit.d = (logic_t **)(ulong)bVar2;
  sVar3 = nonstd::span_lite::span<const_slang::logic_t,_18446744073709551615UL>::size
                    ((span<const_slang::logic_t,_18446744073709551615UL> *)auStack_20);
  local_98 = sVar3 - (j - 0x12);
  while (local_98 = local_98 + -1, local_98 != 0) {
    lVar1 = (long)nextDigit.d * 10;
    bVar2 = fromDecimalDigits::anon_class_8_1_54a39804::operator()
                      ((anon_class_8_1_54a39804 *)&writeWord.maxWord);
    nextDigit.d = (logic_t **)(lVar1 + (ulong)bVar2);
    local_40.val = local_40.val * 10;
  }
  fromDecimalDigits::anon_class_32_4_88832beb::operator()((anon_class_32_4_88832beb *)&i);
  SVar5.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar5.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar5.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar5.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar5.super_SVIntStorage.field_0.val = this.val;
  return (SVInt)SVar5.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDecimalDigits(bitwidth_t bits, bool isSigned, span<logic_t const> digits) {
    SVInt result = allocZeroed(bits, isSigned, false);

    constexpr int charsPerWord = 18; // 18 decimal digits can fit in a 64-bit word
    const logic_t* d = digits.data();
    uint64_t maxWord = (uint64_t)std::pow(10, charsPerWord);
    uint32_t count = 0;
    uint64_t word;

    auto nextDigit = [&]() {
        uint8_t v = d->value;
        if (v >= 10) {
            throw std::invalid_argument(fmt::format("Digit {} too large for radix {}", v, 10));
        }
        d++;
        return v;
    };

    auto writeWord = [&]() {
        if (!count) {
            if (word)
                result.pVal[count++] = word;
        }
        else {
            uint64_t carry = mulOne(result.pVal, result.pVal, count, maxWord);
            carry += addOne(result.pVal, result.pVal, count, word);
            if (carry)
                result.pVal[count++] = carry;
        }
    };

    size_t i;
    for (i = charsPerWord; i < digits.size(); i += charsPerWord) {
        word = nextDigit();
        for (size_t j = charsPerWord - 1; j != 0; j--)
            word = word * 10 + nextDigit();

        writeWord();
    }

    maxWord = 10;
    word = nextDigit();

    for (size_t j = digits.size() - (i - charsPerWord) - 1; j > 0; j--) {
        word = word * 10 + nextDigit();
        maxWord *= 10;
    }

    writeWord();

    return result;
}